

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataMarshaller.cpp
# Opt level: O2

void __thiscall
firmata::FirmataMarshaller::sendDigital(FirmataMarshaller *this,uint8_t pin,uint8_t value)

{
  size_t in_RCX;
  undefined3 in_register_00000011;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (this->FirmataStream != (Stream *)0x0) {
    serial_wiring::Stream::write
              (this->FirmataStream,0xf5,
               (void *)CONCAT44(in_register_00000014,CONCAT31(in_register_00000011,value)),in_RCX);
    serial_wiring::Stream::write
              (this->FirmataStream,(uint)(pin & 0x7f),(void *)CONCAT44(extraout_var,extraout_EDX),
               in_RCX);
    serial_wiring::Stream::write
              (this->FirmataStream,(uint)(value != '\0'),
               (void *)CONCAT44(extraout_var_00,extraout_EDX_00),in_RCX);
    return;
  }
  return;
}

Assistant:

void FirmataMarshaller::sendDigital(uint8_t pin, uint8_t value)
const
{
  if ( (Stream *)NULL == FirmataStream ) { return; }
  FirmataStream->write(SET_DIGITAL_PIN_VALUE);
  FirmataStream->write(pin & 0x7F);
  FirmataStream->write(value != 0);
}